

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O3

void Abc_NtkShareFindBestMatch(Vec_Ptr_t *vBuckets,Vec_Int_t **pvInput,Vec_Int_t **pvInput2)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int *piVar7;
  bool bVar8;
  int *pBeg2;
  undefined8 *__ptr;
  void *pvVar9;
  void *pvVar10;
  int *piVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  int *piVar22;
  Vec_Int_t *local_70;
  Vec_Int_t *local_60;
  
  __ptr = (undefined8 *)malloc(0x10);
  *__ptr = 0x28;
  pvVar9 = malloc(0x140);
  __ptr[1] = pvVar9;
  if (0 < (long)vBuckets->nSize) {
    uVar17 = 0;
    uVar21 = 0x28;
    lVar15 = (long)vBuckets->nSize;
    do {
      if (vBuckets->nSize < lVar15) goto LAB_002c5fe5;
      pvVar9 = vBuckets->pArray[lVar15 + -1];
      if (0 < *(int *)((long)pvVar9 + 4)) {
        lVar19 = 0;
        do {
          uVar3 = *(undefined8 *)(*(long *)((long)pvVar9 + 8) + lVar19 * 8);
          uVar20 = (uint)uVar21;
          if (uVar17 == uVar20) {
            if (0xf < (int)uVar20) {
              uVar21 = (ulong)(uVar20 * 2);
              if ((void *)__ptr[1] == (void *)0x0) {
                pvVar10 = malloc(uVar21 * 8);
              }
              else {
                pvVar10 = realloc((void *)__ptr[1],uVar21 * 8);
              }
              __ptr[1] = pvVar10;
              goto LAB_002c5ce6;
            }
            if ((void *)__ptr[1] == (void *)0x0) {
              pvVar10 = malloc(0x80);
            }
            else {
              pvVar10 = realloc((void *)__ptr[1],0x80);
            }
            __ptr[1] = pvVar10;
            uVar17 = uVar20 + 1;
            *(undefined8 *)((long)pvVar10 + (long)(int)uVar20 * 8) = uVar3;
            uVar21 = 0x10;
          }
          else {
            pvVar10 = (void *)__ptr[1];
LAB_002c5ce6:
            lVar12 = (long)(int)uVar17;
            uVar17 = uVar17 + 1;
            *(undefined8 *)((long)pvVar10 + lVar12 * 8) = uVar3;
            if (uVar17 == 0x28) {
              *(undefined4 *)((long)__ptr + 4) = 0x28;
              *(int *)__ptr = (int)uVar21;
              uVar17 = 0x28;
              goto LAB_002c5d51;
            }
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < *(int *)((long)pvVar9 + 4));
        *(uint *)((long)__ptr + 4) = uVar17;
        *(int *)__ptr = (int)uVar21;
      }
      bVar8 = 1 < lVar15;
      lVar15 = lVar15 + -1;
    } while (bVar8);
    if (0 < (int)uVar17) {
LAB_002c5d51:
      pvVar9 = (void *)__ptr[1];
      iVar13 = 0;
      iVar14 = 0;
      local_60 = (Vec_Int_t *)0x0;
      local_70 = (Vec_Int_t *)0x0;
      uVar21 = (ulong)uVar17;
      do {
        pVVar4 = *(Vec_Int_t **)((long)pvVar9 + uVar21 * 8 + -8);
        uVar16 = (ulong)uVar17;
        do {
          if (uVar21 != uVar16) {
            pVVar5 = *(Vec_Int_t **)((long)pvVar9 + uVar16 * 8 + -8);
            pVVar4->pArray = pVVar4->pArray + 2;
            piVar6 = pVVar5->pArray;
            piVar11 = piVar6 + 2;
            pVVar5->pArray = piVar11;
            pVVar4->nSize = pVVar4->nSize + -2;
            iVar1 = pVVar5->nSize;
            pVVar5->nSize = iVar1 + -2;
            iVar2 = pVVar4->nSize;
            iVar18 = 0;
            piVar7 = pVVar4->pArray;
            if ((0 < (long)iVar2) && (2 < iVar1)) {
              iVar18 = 0;
              piVar22 = piVar7;
              do {
                if (*piVar22 == *piVar11) {
                  piVar22 = piVar22 + 1;
                  piVar11 = piVar11 + 1;
                  iVar18 = iVar18 + 1;
                }
                else if (*piVar22 < *piVar11) {
                  piVar22 = piVar22 + 1;
                }
                else {
                  piVar11 = piVar11 + 1;
                }
              } while ((piVar22 < piVar7 + iVar2) && (piVar11 < piVar6 + iVar1));
            }
            pVVar4->pArray = piVar7 + -2;
            piVar11 = pVVar5->pArray;
            pVVar5->pArray = piVar11 + -2;
            pVVar4->nSize = iVar2 + 2;
            iVar1 = pVVar5->nSize;
            pVVar5->nSize = iVar1 + 2;
            if (1 < iVar18) {
              if ((pVVar4->nSize < 2) || (iVar1 < 0)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              iVar1 = piVar11[-1];
              if (iVar1 < pVVar4->pArray[1]) {
                iVar1 = pVVar4->pArray[1];
              }
              if ((iVar14 < iVar18) || ((iVar14 == iVar18 && (iVar1 < iVar13)))) {
                iVar14 = iVar18;
                iVar13 = iVar1;
                local_70 = pVVar5;
                local_60 = pVVar4;
              }
            }
          }
          bVar8 = 1 < (long)uVar16;
          uVar16 = uVar16 - 1;
        } while (bVar8);
        bVar8 = 1 < (long)uVar21;
        uVar21 = uVar21 - 1;
      } while (bVar8);
      goto LAB_002c5e9b;
    }
  }
  pvVar9 = (void *)__ptr[1];
  local_70 = (Vec_Int_t *)0x0;
  local_60 = (Vec_Int_t *)0x0;
LAB_002c5e9b:
  if (pvVar9 != (void *)0x0) {
    free(pvVar9);
  }
  free(__ptr);
  *pvInput = local_60;
  *pvInput2 = local_70;
  if (local_60 == (Vec_Int_t *)0x0) {
    return;
  }
  if ((1 < local_60->nSize) && (uVar17 = local_60->nSize - 2, (int)uVar17 < vBuckets->nSize)) {
    pvVar9 = vBuckets->pArray[uVar17];
    uVar17 = *(uint *)((long)pvVar9 + 4);
    lVar15 = (ulong)uVar17 + 1;
    do {
      if ((int)lVar15 + -1 < 1) goto LAB_002c5fc6;
      lVar19 = lVar15 + -1;
      lVar12 = lVar15 * 8;
      lVar15 = lVar19;
    } while (*(Vec_Int_t **)(*(long *)((long)pvVar9 + 8) + -0x10 + lVar12) != local_60);
    for (; (int)lVar19 < (int)uVar17; lVar19 = lVar19 + 1) {
      *(undefined8 *)(*(long *)((long)pvVar9 + 8) + -8 + lVar19 * 8) =
           *(undefined8 *)(*(long *)((long)pvVar9 + 8) + lVar19 * 8);
    }
    *(uint *)((long)pvVar9 + 4) = uVar17 - 1;
    if ((1 < local_70->nSize) && (uVar17 = local_70->nSize - 2, (int)uVar17 < vBuckets->nSize)) {
      pvVar9 = vBuckets->pArray[uVar17];
      uVar17 = *(uint *)((long)pvVar9 + 4);
      lVar15 = (ulong)uVar17 + 1;
      while (0 < (int)lVar15 + -1) {
        lVar19 = lVar15 + -1;
        lVar12 = lVar15 * 8;
        lVar15 = lVar19;
        if (*(Vec_Int_t **)(*(long *)((long)pvVar9 + 8) + -0x10 + lVar12) == local_70) {
          for (; (int)lVar19 < (int)uVar17; lVar19 = lVar19 + 1) {
            *(undefined8 *)(*(long *)((long)pvVar9 + 8) + -8 + lVar19 * 8) =
                 *(undefined8 *)(*(long *)((long)pvVar9 + 8) + lVar19 * 8);
          }
          *(uint *)((long)pvVar9 + 4) = uVar17 - 1;
          return;
        }
      }
LAB_002c5fc6:
      __assert_fail("i >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x304,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
    }
  }
LAB_002c5fe5:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Abc_NtkShareFindBestMatch( Vec_Ptr_t * vBuckets, Vec_Int_t ** pvInput, Vec_Int_t ** pvInput2 )
{
    int nPoolSize = 40;
    Vec_Ptr_t * vPool = Vec_PtrAlloc( nPoolSize );
    Vec_Ptr_t * vBucket;
    Vec_Int_t * vInput, * vInput2, * vInputBest = NULL, * vInputBest2 = NULL;
    int i, k, Cost, CostBest = 0, Delay, DelayBest = 0;

    Vec_PtrForEachEntryReverse( Vec_Ptr_t *, vBuckets, vBucket, i )
        Vec_PtrForEachEntry( Vec_Int_t *, vBucket, vInput, k )
        {
            Vec_PtrPush( vPool, vInput );
            if ( Vec_PtrSize(vPool) == nPoolSize )
                goto outside;
        }
outside:

    Vec_PtrForEachEntryReverse( Vec_Int_t *, vPool, vInput, i )
    Vec_PtrForEachEntryReverse( Vec_Int_t *, vPool, vInput2, k )
    {
        if ( i == k )
            continue;

        vInput->pArray += SHARE_NUM;
        vInput2->pArray += SHARE_NUM;
        vInput->nSize -= SHARE_NUM;
        vInput2->nSize -= SHARE_NUM;

        Cost = Vec_IntTwoCountCommon(vInput, vInput2);

        vInput->pArray -= SHARE_NUM;
        vInput2->pArray -= SHARE_NUM;
        vInput->nSize += SHARE_NUM;
        vInput2->nSize += SHARE_NUM;

        if ( Cost < 2 )
            continue;

        Delay = Abc_MaxInt( Vec_IntEntry(vInput, 1), Vec_IntEntry(vInput2, 1) );

        if ( CostBest < Cost || (CostBest == Cost && (DelayBest > Delay)) )
        {
            CostBest = Cost;
            DelayBest = Delay;
            vInputBest = vInput;
            vInputBest2 = vInput2;
        }
    }
    Vec_PtrFree( vPool );

    *pvInput  = vInputBest;
    *pvInput2 = vInputBest2;

    if ( vInputBest == NULL )
        return;

    Vec_PtrRemove( (Vec_Ptr_t *)Vec_PtrEntry(vBuckets, Vec_IntSize(vInputBest)-SHARE_NUM),  (Vec_Int_t *)vInputBest ); 
    Vec_PtrRemove( (Vec_Ptr_t *)Vec_PtrEntry(vBuckets, Vec_IntSize(vInputBest2)-SHARE_NUM), (Vec_Int_t *)vInputBest2 ); 
}